

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat4 * dja::operator*(mat4 *__return_storage_ptr__,mat4 *a,mat4 *b)

{
  vec4 *pvVar1;
  int j;
  long lVar2;
  vec4 *b_00;
  int i;
  long lVar3;
  float_t fVar4;
  mat4 t;
  vec4 local_70 [4];
  
  transpose(b);
  __return_storage_ptr__->m[0].x = 1.0;
  __return_storage_ptr__->m[0].y = 0.0;
  __return_storage_ptr__->m[0].z = 0.0;
  *(undefined8 *)&__return_storage_ptr__->m[0].w = 0;
  __return_storage_ptr__->m[1].y = 1.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[2].z = 1.0;
  *(undefined8 *)&__return_storage_ptr__->m[2].w = 0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 1.0;
  lVar2 = 0;
  pvVar1 = __return_storage_ptr__->m;
  for (; lVar2 != 4; lVar2 = lVar2 + 1) {
    b_00 = local_70;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar4 = dot(a->m + lVar2,b_00);
      (&((vec4 *)&pvVar1->x)->x)[lVar3] = fVar4;
      b_00 = b_00 + 1;
    }
    pvVar1 = pvVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(const mat4& a, const mat4& b)
{
    mat4 t = transpose(b), r;

    for (int j = 0; j < 4; ++j)
    for (int i = 0; i < 4; ++i)
        r[j][i] = dot(a[j], t[i]);

    return r;
}